

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::basic_substring<char>::last_not_of(basic_substring<char> *this,ro_substr chars,size_t start)

{
  bool bVar1;
  error_flags eVar2;
  size_t in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t j;
  bool gotit;
  size_t i;
  ulong local_50;
  size_t local_40;
  
  bVar1 = true;
  if (in_RCX != 0xffffffffffffffff) {
    bVar1 = in_RCX <= (ulong)in_RDI[1];
  }
  if (!bVar1) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x344e8b,(char *)0x176c,"check failed: %s",
                 "start == npos || (start >= 0 && start <= len)");
  }
  if (in_RCX == 0xffffffffffffffff) {
    in_RCX = in_RDI[1];
  }
  do {
    local_40 = in_RCX - 1;
    if (local_40 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    bVar1 = true;
    for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
      if (*(char *)(*in_RDI + local_40) == *(char *)(in_RSI + local_50)) {
        bVar1 = false;
        break;
      }
    }
    in_RCX = local_40;
    if (bVar1) {
      return local_40;
    }
  } while( true );
}

Assistant:

size_t last_not_of(ro_substr chars, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }